

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O3

void finish(sender *s)

{
  io_buf *piVar1;
  int *__ptr;
  char *__ptr_00;
  
  piVar1 = s->buf;
  __ptr = (piVar1->files)._begin;
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  (piVar1->files)._begin = (int *)0x0;
  (piVar1->files)._end = (int *)0x0;
  (piVar1->files).end_array = (int *)0x0;
  piVar1 = s->buf;
  __ptr_00 = (piVar1->space)._begin;
  if (__ptr_00 != (char *)0x0) {
    free(__ptr_00);
  }
  (piVar1->space)._begin = (char *)0x0;
  (piVar1->space)._end = (char *)0x0;
  (piVar1->space).end_array = (char *)0x0;
  free(s->delay_ring);
  if (s->buf != (io_buf *)0x0) {
    (*s->buf->_vptr_io_buf[3])();
    return;
  }
  return;
}

Assistant:

void finish(sender& s)
{
  s.buf->files.delete_v();
  s.buf->space.delete_v();
  free(s.delay_ring);
  delete s.buf;
}